

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

int __thiscall
cxxopts::values::standard_value<bool>::clone
          (standard_value<bool> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _func_int **local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::
  make_shared<cxxopts::values::standard_value<bool>,cxxopts::values::standard_value<bool>const&>
            ((standard_value<bool> *)&stack0xffffffffffffffe8);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_abstract_value<bool>).super_Value._vptr_Value = local_18;
  (this->super_abstract_value<bool>).super_Value.super_enable_shared_from_this<cxxopts::Value>.
  _M_weak_this.super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_18 = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xfffffffffffffff0);
  return (int)this;
}

Assistant:

std::shared_ptr<Value>
      clone() const override
      {
        return std::make_shared<standard_value<bool>>(*this);
      }